

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__line_stipple_enable
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ParserTemplateBase *this_00;
  StringHash attributeHash;
  long *in_RSI;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  line_stipple_enable__AttributeData *attributeData;
  ParserChar *in_stack_00000088;
  ParserChar *in_stack_00000090;
  StringHash in_stack_00000098;
  ErrorType in_stack_000000a0;
  Severity in_stack_000000a4;
  ParserTemplateBase *in_stack_000000a8;
  undefined7 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffaf;
  ParserTemplateBase *in_stack_ffffffffffffffb0;
  SaxParser *additionalText;
  ParserChar *text;
  undefined8 *puVar2;
  bool local_1;
  
  this_00 = (ParserTemplateBase *)
            GeneratedSaxParser::ParserTemplateBase::
            newData<COLLADASaxFWL14::line_stipple_enable__AttributeData>
                      (in_stack_ffffffffffffffb0,
                       (void **)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  puVar2 = (undefined8 *)*in_RSI;
  if (puVar2 == (undefined8 *)0x0) {
LAB_0089cc09:
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          text = (ParserChar *)*puVar2;
          if (text == (ParserChar *)0x0) goto LAB_0089cc09;
          attributeHash = GeneratedSaxParser::Utils::calculateStringHash(text);
          if (puVar2 + 1 == (undefined8 *)0x0) {
            return false;
          }
          additionalText = (SaxParser *)puVar2[1];
          puVar2 = puVar2 + 2;
          if (attributeHash != 0x76887d) break;
          (this_00->super_Parser).mSaxParser = additionalText;
        }
        if (attributeHash != 0x7c83b5) break;
        bVar1 = GeneratedSaxParser::Utils::toBool((ParserChar *)0x7c83b5,(bool *)0x89cb80);
        *(bool *)&(this_00->super_Parser)._vptr_Parser = bVar1;
        if (((in_stack_ffffffffffffffaf & 1) != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (this_00,(Severity)((ulong)puVar2 >> 0x20),(ErrorType)puVar2,
                               (StringHash)text,attributeHash,(ParserChar *)additionalText), bVar1))
        {
          return false;
        }
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098,
                         in_stack_00000090,in_stack_00000088);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__line_stipple_enable( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__line_stipple_enable( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

line_stipple_enable__AttributeData* attributeData = newData<line_stipple_enable__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_value:
    {
bool failed;
attributeData->value = GeneratedSaxParser::Utils::toBool(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LINE_STIPPLE_ENABLE,
        HASH_ATTRIBUTE_value,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_param:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_LINE_STIPPLE_ENABLE,
            HASH_ATTRIBUTE_param,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_LINE_STIPPLE_ENABLE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}